

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vdasher.cpp
# Opt level: O1

void __thiscall VDasher::cubicTo(VDasher *this,VPointF *cp1,VPointF *cp2,VPointF *e)

{
  VPointF *p1;
  VPointF *pVVar1;
  float fVar2;
  float len;
  VBezier b;
  VBezier left;
  VBezier right;
  VPointF local_c0;
  VPointF local_b8;
  VPointF local_b0;
  VPointF local_a8;
  VPointF VStack_a0;
  VPointF local_98;
  VPointF VStack_90;
  VPointF *local_80;
  VPointF *local_78;
  undefined1 local_70 [16];
  VPointF local_60;
  VPointF local_58;
  VPointF local_50;
  VPointF VStack_48;
  VPointF local_40;
  VPointF VStack_38;
  
  p1 = &this->mCurPt;
  VBezier::fromPoints(p1,cp1,cp2,e);
  fVar2 = VBezier::length((VBezier *)&local_a8);
  if (fVar2 <= this->mCurrentLength) {
    this->mCurrentLength = this->mCurrentLength - fVar2;
    pVVar1 = e;
  }
  else {
    len = this->mCurrentLength;
    local_80 = p1;
    local_78 = e;
    if (len < fVar2) {
      do {
        fVar2 = fVar2 - len;
        VBezier::splitAtLength((VBezier *)&local_a8,len,(VBezier *)local_70,(VBezier *)&local_50);
        local_b0.mx = (float)local_70._8_4_;
        local_b0.my = (float)local_70._12_4_;
        local_b8 = local_60;
        local_c0 = local_58;
        addCubic(this,&local_b0,&local_b8,&local_c0);
        updateActiveSegment(this);
        local_a8 = local_50;
        VStack_a0 = VStack_48;
        local_98 = local_40;
        VStack_90 = VStack_38;
        this->mCurPt = local_50;
        len = this->mCurrentLength;
      } while (len < fVar2);
    }
    p1 = local_80;
    pVVar1 = local_78;
    if (fVar2 <= 0.1) goto LAB_0010ca1d;
    this->mCurrentLength = len - fVar2;
    cp1 = &local_b0;
    local_b0 = VStack_a0;
    cp2 = &local_b8;
    local_b8 = local_98;
    e = &local_c0;
    local_c0 = VStack_90;
  }
  addCubic(this,cp1,cp2,e);
LAB_0010ca1d:
  if (this->mCurrentLength <= 0.1 && this->mCurrentLength != 0.1) {
    updateActiveSegment(this);
  }
  *p1 = *pVVar1;
  return;
}

Assistant:

void VDasher::cubicTo(const VPointF &cp1, const VPointF &cp2, const VPointF &e)
{
    VBezier left, right;
    VBezier b = VBezier::fromPoints(mCurPt, cp1, cp2, e);
    float   bezLen = b.length();

    if (bezLen <= mCurrentLength) {
        mCurrentLength -= bezLen;
        addCubic(cp1, cp2, e);
    } else {
        while (bezLen > mCurrentLength) {
            bezLen -= mCurrentLength;
            b.splitAtLength(mCurrentLength, &left, &right);

            addCubic(left.pt2(), left.pt3(), left.pt4());
            updateActiveSegment();

            b = right;
            mCurPt = b.pt1();
        }
        // handle remainder
        if (bezLen > tolerance) {
            mCurrentLength -= bezLen;
            addCubic(b.pt2(), b.pt3(), b.pt4());
        }
    }

    if (mCurrentLength < tolerance) updateActiveSegment();

    mCurPt = e;
}